

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void Load16x4_SSE2(uint8_t *r0,uint8_t *r8,int stride,__m128i *p1,__m128i *p0,__m128i *q0,
                  __m128i *q1)

{
  longlong lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  
  Load8x4_SSE2(r0,stride,p1,q0);
  Load8x4_SSE2(r8,stride,p0,q1);
  uVar4 = *(undefined4 *)((long)*p1 + 4);
  lVar6 = (*p1)[1];
  uVar2 = *(undefined4 *)((long)*p1 + 0xc);
  lVar1 = (*p0)[0];
  lVar7 = (*q0)[0];
  uVar3 = *(undefined4 *)((long)*q0 + 4);
  lVar8 = (*q0)[1];
  uVar5 = *(undefined4 *)((long)*q0 + 0xc);
  *(int *)*p1 = (int)(*p1)[0];
  *(undefined4 *)((long)*p1 + 4) = uVar4;
  *(int *)(*p1 + 1) = (int)lVar1;
  *(int *)((long)*p1 + 0xc) = (int)((ulong)lVar1 >> 0x20);
  lVar1 = (*p0)[1];
  *(int *)*p0 = (int)lVar6;
  *(undefined4 *)((long)*p0 + 4) = uVar2;
  *(int *)(*p0 + 1) = (int)lVar1;
  *(int *)((long)*p0 + 0xc) = (int)((ulong)lVar1 >> 0x20);
  lVar1 = (*q1)[0];
  *(int *)*q0 = (int)lVar7;
  *(undefined4 *)((long)*q0 + 4) = uVar3;
  *(int *)(*q0 + 1) = (int)lVar1;
  *(int *)((long)*q0 + 0xc) = (int)((ulong)lVar1 >> 0x20);
  lVar1 = (*q1)[1];
  *(int *)*q1 = (int)lVar8;
  *(undefined4 *)((long)*q1 + 4) = uVar5;
  *(int *)(*q1 + 1) = (int)lVar1;
  *(int *)((long)*q1 + 0xc) = (int)((ulong)lVar1 >> 0x20);
  return;
}

Assistant:

static WEBP_INLINE void Load16x4_SSE2(const uint8_t* const r0,
                                      const uint8_t* const r8,
                                      int stride,
                                      __m128i* const p1, __m128i* const p0,
                                      __m128i* const q0, __m128i* const q1) {
  // Assume the pixels around the edge (|) are numbered as follows
  //                00 01 | 02 03
  //                10 11 | 12 13
  //                 ...  |  ...
  //                e0 e1 | e2 e3
  //                f0 f1 | f2 f3
  //
  // r0 is pointing to the 0th row (00)
  // r8 is pointing to the 8th row (80)

  // Load
  // p1 = 71 61 51 41 31 21 11 01 70 60 50 40 30 20 10 00
  // q0 = 73 63 53 43 33 23 13 03 72 62 52 42 32 22 12 02
  // p0 = f1 e1 d1 c1 b1 a1 91 81 f0 e0 d0 c0 b0 a0 90 80
  // q1 = f3 e3 d3 c3 b3 a3 93 83 f2 e2 d2 c2 b2 a2 92 82
  Load8x4_SSE2(r0, stride, p1, q0);
  Load8x4_SSE2(r8, stride, p0, q1);

  {
    // p1 = f0 e0 d0 c0 b0 a0 90 80 70 60 50 40 30 20 10 00
    // p0 = f1 e1 d1 c1 b1 a1 91 81 71 61 51 41 31 21 11 01
    // q0 = f2 e2 d2 c2 b2 a2 92 82 72 62 52 42 32 22 12 02
    // q1 = f3 e3 d3 c3 b3 a3 93 83 73 63 53 43 33 23 13 03
    const __m128i t1 = *p1;
    const __m128i t2 = *q0;
    *p1 = _mm_unpacklo_epi64(t1, *p0);
    *p0 = _mm_unpackhi_epi64(t1, *p0);
    *q0 = _mm_unpacklo_epi64(t2, *q1);
    *q1 = _mm_unpackhi_epi64(t2, *q1);
  }
}